

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O1

void pzshape::TPZShapeTetra::SideShapeOrder
               (int side,TPZVec<long> *id,int order,TPZGenMatrix<int> *shapeorders)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  undefined1 auVar20 [16];
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  undefined1 auVar31 [16];
  int a;
  int b;
  TPZManVector<long,_4> locid;
  TPZGenMatrix<int> locshapeorders;
  TPZStack<int,_10> lowersides;
  TPZManVector<long,_4> local_d0;
  TPZGenMatrix<int> local_90;
  TPZManVector<int,_10> local_78;
  
  if (side < 4) {
    if (shapeorders->fRows != 1) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x216);
    }
    piVar5 = TPZGenMatrix<int>::operator()(shapeorders,0,0);
    *piVar5 = 1;
    piVar5 = TPZGenMatrix<int>::operator()(shapeorders,0,1);
    *piVar5 = 0;
    piVar5 = TPZGenMatrix<int>::operator()(shapeorders,0,2);
    *piVar5 = 0;
  }
  else if (side < 10) {
    if (shapeorders->fRows != (long)(int)(order - 1U)) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x221);
    }
    if (1 < order) {
      uVar13 = 0;
      do {
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
        *piVar5 = (int)uVar13 + 2;
        uVar13 = uVar13 + 1;
      } while (order - 1U != uVar13);
    }
  }
  else if (side < 0xe) {
    iVar6 = (order + -1) * (order + -2);
    uVar7 = iVar6 / 2;
    if (shapeorders->fRows != (long)(int)uVar7) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x22d);
    }
    TPZStack<int,_10>::TPZStack((TPZStack<int,_10> *)&local_78);
    pztopology::TPZTetrahedron::LowerDimensionSides(side,(TPZStack<int,_10> *)&local_78);
    TPZStack<int,_10>::Push((TPZStack<int,_10> *)&local_78,side);
    iVar2 = pztopology::TPZTetrahedron::NSideNodes(side);
    TPZManVector<long,_4>::TPZManVector(&local_d0,(long)iVar2);
    if (0 < local_d0.super_TPZVec<long>.fNElements) {
      lVar11 = 0;
      do {
        iVar2 = pztopology::TPZTetrahedron::ContainedSideLocId(side,(int)lVar11);
        local_d0.super_TPZVec<long>.fStore[lVar11] = id->fStore[iVar2];
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_d0.super_TPZVec<long>.fNElements);
    }
    TPZGenMatrix<int>::TPZGenMatrix(&local_90,(long)(int)uVar7,3);
    TPZShapeTriang::SideShapeOrder(6,&local_d0.super_TPZVec<long>,order,&local_90);
    if (1 < iVar6) {
      uVar13 = 0;
      do {
        piVar5 = TPZGenMatrix<int>::operator()(&local_90,uVar13,0);
        iVar6 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,0);
        *piVar5 = iVar6;
        piVar5 = TPZGenMatrix<int>::operator()(&local_90,uVar13,1);
        iVar6 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,1);
        *piVar5 = iVar6;
        piVar5 = TPZGenMatrix<int>::operator()(&local_90,uVar13,2);
        iVar6 = *piVar5;
        piVar5 = TPZGenMatrix<int>::operator()(shapeorders,uVar13,2);
        *piVar5 = iVar6;
        uVar13 = uVar13 + 1;
      } while (uVar7 != uVar13);
    }
    TPZGenMatrix<int>::~TPZGenMatrix(&local_90);
    if (local_d0.super_TPZVec<long>.fStore == local_d0.fExtAlloc) {
      local_d0.super_TPZVec<long>.fStore = (long *)0x0;
    }
    local_d0.super_TPZVec<long>.fNAlloc = 0;
    local_d0.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
    if (local_d0.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_d0.super_TPZVec<long>.fStore);
    }
    TPZManVector<int,_10>::~TPZManVector(&local_78);
  }
  else {
    if (order < 4) {
      uVar13 = 0;
    }
    else {
      uVar3 = order & 0x7ffffffc;
      uVar7 = order - 4;
      uVar15 = 0;
      uVar16 = 1;
      uVar17 = 2;
      uVar1 = 3;
      uVar19 = 0;
      uVar22 = 0;
      uVar24 = 0;
      uVar26 = 0;
      do {
        uVar25 = uVar26;
        uVar23 = uVar24;
        uVar21 = uVar22;
        uVar18 = uVar19;
        uVar30 = uVar1;
        uVar29 = uVar17;
        uVar28 = uVar16;
        uVar27 = uVar15;
        auVar20._0_4_ = uVar27 + 1;
        auVar20._4_4_ = uVar28 + 1;
        auVar20._8_4_ = uVar29 + 1;
        auVar20._12_4_ = uVar30 + 1;
        auVar31._4_4_ = uVar28 + 2;
        auVar31._12_4_ = uVar30 + 2;
        auVar31._0_4_ = auVar31._4_4_;
        auVar31._8_4_ = auVar31._12_4_;
        uVar19 = (auVar20._0_4_ * (uVar27 + 2) >> 1) + uVar18;
        uVar22 = ((uint)(auVar31._4_4_ * auVar20._4_4_) >> 1) + uVar21;
        uVar24 = ((uint)((auVar20._8_8_ & 0xffffffff) * (ulong)(uVar29 + 2)) >> 1) + uVar23;
        uVar26 = ((uint)((auVar31._8_8_ & 0xffffffff) * (ulong)auVar20._12_4_) >> 1) + uVar25;
        uVar3 = uVar3 - 4;
        uVar15 = uVar27 + 4;
        uVar16 = uVar28 + 4;
        uVar17 = uVar29 + 4;
        uVar1 = uVar30 + 4;
      } while (uVar3 != 0);
      uVar15 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar27 ^ 0x80000000));
      uVar16 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar28 ^ 0x80000000));
      uVar17 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar29 ^ 0x80000000));
      uVar7 = -(uint)((int)(uVar7 ^ 0x80000000) < (int)(uVar30 ^ 0x80000000));
      uVar13 = (ulong)((~uVar7 & uVar26 | uVar25 & uVar7) + (~uVar16 & uVar22 | uVar21 & uVar16) +
                      (~uVar17 & uVar24 | uVar23 & uVar17) + (~uVar15 & uVar19 | uVar18 & uVar15));
    }
    if (shapeorders->fRows != uVar13) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
                 ,0x251);
    }
    if (3 < order) {
      iVar12 = order + -3;
      iVar6 = 0;
      iVar2 = 4;
      iVar14 = 0;
      do {
        iVar4 = 0;
        iVar8 = iVar12;
        iVar10 = iVar2;
        iVar9 = iVar2;
        do {
          do {
            if (iVar10 + -4 < iVar12) {
              lVar11 = (long)iVar14;
              piVar5 = TPZGenMatrix<int>::operator()(shapeorders,lVar11,0);
              *piVar5 = iVar10;
              piVar5 = TPZGenMatrix<int>::operator()(shapeorders,lVar11,1);
              *piVar5 = iVar10;
              piVar5 = TPZGenMatrix<int>::operator()(shapeorders,lVar11,2);
              *piVar5 = iVar10;
              iVar14 = iVar14 + 1;
            }
            iVar8 = iVar8 + -1;
            iVar10 = iVar10 + 1;
          } while (iVar8 != 0);
          iVar4 = iVar4 + 1;
          iVar10 = iVar9 + 1;
          iVar8 = iVar12;
          iVar9 = iVar10;
        } while (iVar4 != iVar12);
        iVar6 = iVar6 + 1;
        iVar2 = iVar2 + 1;
      } while (iVar6 != iVar12);
    }
  }
  return;
}

Assistant:

void TPZShapeTetra::SideShapeOrder(const int side,  const TPZVec<int64_t> &id, const int order, TPZGenMatrix<int> &shapeorders)
    {
        //DebugStop();
        if (side<=3)
        {
            if (shapeorders.Rows() != 1)
            {
                DebugStop();
            }
            shapeorders(0,0) = 1;
            shapeorders(0,1) = 0;
            shapeorders(0,2) = 0;
        }
        else if (side>=4 && side<=9)
        {
            int nshape = order-1;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            for (int ioy = 0; ioy < order-1; ioy++)
            {
                shapeorders(ioy,0) = ioy+2;
            }
        }
        else if (side >= 10 && side <= 13)
        {
            int nshape = (order-2)*(order-1)/2;
            if (shapeorders.Rows() != nshape)
            {
                DebugStop();
            }
            TPZStack<int> lowersides;
            LowerDimensionSides(side, lowersides);
            lowersides.Push(side);
            
            int nnodes = NSideNodes(side);
            
            TPZManVector<int64_t, 4> locid(nnodes);
            for (int node=0; node<locid.size(); node++) {
                locid[node] = id[ContainedSideLocId(side, node)];
            }
            
            TPZGenMatrix<int> locshapeorders(nshape,3);
            
            
            TPZShapeTriang::SideShapeOrder(6,locid, order, locshapeorders);
            
            for (int il = 0; il<nshape; il++)
            {
                shapeorders(il, 0) = locshapeorders(il, 0);
                shapeorders(il, 1) = locshapeorders(il, 1);
                shapeorders(il, 2) = locshapeorders(il, 2);
            }
        }
        else
        {   // interno
            int totsum = 0,sum;
            int i;
            for(i=0;i<order-3;i++) {
                sum = (i+1)*(i+2) / 2;
                totsum += sum;
            }
            int nshape = totsum;
            
            if (shapeorders.Rows() != nshape) {
                DebugStop();
            }
            int count = 0;
            int ord = order-3;
            for (int i=0;i<ord;i++) {
                for (int j=0;j<ord;j++) {
                    for (int k=0;k<ord;k++) {
                        int a = i;
                        int b = j;
                        int c = k;
                        int soma = a+b+c;
                        if( soma < ord ) { // Duvida
                            shapeorders(count,0) = 4 + soma;
                            shapeorders(count,1) = 4 + soma;
                            shapeorders(count,2) = 4 + soma;
                            count++;
                        }
                    }
                }
            }
//            int orderplus1 = order+1;
//            for (int i=4; i<orderplus1; i++)
//            {
//                for (int j=4; j<orderplus1; j++)
//                {
//                    for (int k=4; k<orderplus1; k++)
//                    {
//                        int a = i;
//                        int b = j;
//                        int c = k;
//                        int soma = a+b+c;
//                        if ((soma)<orderplus1)// Duvida
//                        {
//                            shapeorders(count,0) = soma;
//                            shapeorders(count,1) = soma;
//                            shapeorders(count,2) = soma;
//                            count++;
//                        }
//                    }
//                    
//                }
//            }

        }
    }